

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O3

void print_result(int f,priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                        *pr_queue)

{
  float fVar1;
  v_array<char> tag;
  pointer ppVar2;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  char *__s;
  char temp [30];
  stringstream ss;
  char local_248;
  undefined7 uStack_247;
  ulong local_240;
  undefined1 local_238 [16];
  char *local_228;
  char *pcStack_220;
  char *local_218;
  size_t sStack_210;
  char local_208 [48];
  char *local_1d8;
  char *pcStack_1d0;
  char *local_1c8;
  size_t sStack_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    ppVar2 = (pr_queue->c).
             super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar2 != (pr_queue->c).
                  super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fVar1 = ppVar2->first;
        local_1c8 = (ppVar2->second).end_array;
        sStack_1c0 = (ppVar2->second).erase_count;
        local_1d8 = (ppVar2->second)._begin;
        pcStack_1d0 = (ppVar2->second)._end;
        std::
        priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
        ::pop(pr_queue);
        sprintf(local_208,"%f",SUB84((double)fVar1,0));
        sVar3 = strlen(local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_208,sVar3);
        local_248 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_248,1);
        local_228 = local_1d8;
        pcStack_220 = pcStack_1d0;
        local_218 = local_1c8;
        sStack_210 = sStack_1c0;
        tag._end = pcStack_1d0;
        tag._begin = local_1d8;
        tag.end_array = local_1c8;
        tag.erase_count = sStack_1c0;
        print_tag((stringstream *)local_1b8,tag);
        local_248 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_248,1);
        local_248 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_248,1);
        ppVar2 = (pr_queue->c).
                 super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (ppVar2 != (pr_queue->c).
                         super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_248 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_248,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_247,local_248) != local_238) {
      operator_delete((undefined1 *)CONCAT71(uStack_247,local_248));
    }
    std::__cxx11::stringbuf::str();
    uVar4 = write(f,(void *)CONCAT71(uStack_247,local_248),local_240 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_247,local_248) != local_238) {
      operator_delete((undefined1 *)CONCAT71(uStack_247,local_248));
    }
    if (uVar4 != local_240) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar5 = __errno_location();
      __s = strerror(*piVar5);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dca28);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void print_result(int f, priority_queue<scored_example, vector<scored_example>, compare_scored_examples>& pr_queue)
{
  if (f >= 0)
  {
    char temp[30];
    std::stringstream ss;
    scored_example tmp_example;
    while (!pr_queue.empty())
    {
      tmp_example = pr_queue.top();
      pr_queue.pop();
      sprintf(temp, "%f", tmp_example.first);
      ss << temp;
      ss << ' ';
      print_tag(ss, tmp_example.second);
      ss << ' ';
      ss << '\n';
    }
    ss << '\n';
    ssize_t len = ss.str().size();
#ifdef _WIN32
    ssize_t t = _write(f, ss.str().c_str(), (unsigned int)len);
#else
    ssize_t t = write(f, ss.str().c_str(), (unsigned int)len);
#endif
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}